

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_float_resize(ImVector_float *self,int new_size)

{
  int new_size_local;
  ImVector_float *self_local;
  
  ImVector<float>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_float_resize(ImVector_float* self,int new_size)
{
    return self->resize(new_size);
}